

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::HandleTable::Resize(HandleTable *this)

{
  uint uVar1;
  uint uVar2;
  LRUHandle **ppLVar3;
  LRUHandle *pLVar4;
  uint uVar5;
  LRUHandle **__s;
  uint uVar6;
  LRUHandle *pLVar7;
  uint uVar8;
  uint32_t i;
  ulong uVar9;
  
  uVar1 = this->elems_;
  uVar2 = 4;
  do {
    uVar5 = uVar2;
    uVar2 = uVar5 * 2;
  } while (uVar5 < uVar1);
  __s = (LRUHandle **)operator_new__((ulong)uVar5 << 3);
  memset(__s,0,(ulong)uVar5 << 3);
  uVar2 = this->length_;
  ppLVar3 = this->list_;
  uVar6 = 0;
  for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
    pLVar7 = ppLVar3[uVar9];
    while (pLVar7 != (LRUHandle *)0x0) {
      pLVar4 = pLVar7->next_hash;
      uVar8 = pLVar7->hash & uVar5 - 1;
      pLVar7->next_hash = __s[uVar8];
      __s[uVar8] = pLVar7;
      uVar6 = uVar6 + 1;
      pLVar7 = pLVar4;
    }
  }
  if (uVar1 == uVar6) {
    if (ppLVar3 != (LRUHandle **)0x0) {
      operator_delete__(ppLVar3);
    }
    this->list_ = __s;
    this->length_ = uVar5;
    return;
  }
  __assert_fail("elems_ == count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                ,0x8e,"void leveldb::(anonymous namespace)::HandleTable::Resize()");
}

Assistant:

void Resize() {
    uint32_t new_length = 4;
    while (new_length < elems_) {
      new_length *= 2;
    }
    LRUHandle** new_list = new LRUHandle*[new_length];
    memset(new_list, 0, sizeof(new_list[0]) * new_length);
    uint32_t count = 0;
    for (uint32_t i = 0; i < length_; i++) {
      LRUHandle* h = list_[i];
      while (h != nullptr) {
        LRUHandle* next = h->next_hash;
        uint32_t hash = h->hash;
        LRUHandle** ptr = &new_list[hash & (new_length - 1)];
        h->next_hash = *ptr;
        *ptr = h;
        h = next;
        count++;
      }
    }
    assert(elems_ == count);
    delete[] list_;
    list_ = new_list;
    length_ = new_length;
  }